

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseSourceName(State *state)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  size_t i;
  long lVar9;
  char cVar10;
  long lVar11;
  char cVar12;
  ulong uVar13;
  ulong length_00;
  int length;
  ParseState copy;
  uint local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar8 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar8 + 1;
  state->steps = iVar2 + 1;
  if (0x1ffff < iVar2 || 0xff < iVar8) {
    bVar7 = false;
    goto LAB_002730f2;
  }
  local_28._0_4_ = (state->parse_state).mangled_idx;
  local_28._4_4_ = (state->parse_state).out_cur_idx;
  uStack_20 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  local_2c = 0xffffffff;
  bVar7 = ParseNumber(state,(int *)&local_2c);
  uVar5 = local_2c;
  iVar8 = state->recursion_depth;
  if (bVar7) {
    length_00 = (ulong)(int)local_2c;
    state->recursion_depth = iVar8 + 1;
    iVar2 = state->steps;
    state->steps = iVar2 + 1;
    if (0x1ffff < iVar2 || 0xff < iVar8) goto LAB_002730e2;
    pcVar3 = state->mangled_begin;
    lVar11 = (long)(state->parse_state).mangled_idx;
    if (local_2c == 0) goto LAB_00273163;
    cVar10 = pcVar3[lVar11];
    if (cVar10 == '\0') goto LAB_002730e2;
    lVar4 = lVar11 + 1;
    uVar13 = 0;
    do {
      if (length_00 - 1 == uVar13) goto LAB_00273138;
      uVar1 = uVar13 + 1;
      lVar6 = uVar13 + lVar4;
      uVar13 = uVar1;
    } while (pcVar3[lVar6] != '\0');
    if (uVar1 < length_00) goto LAB_002730e2;
LAB_00273138:
    if (local_2c < 0xc) {
LAB_00273163:
      MaybeAppendWithLength(state,pcVar3 + lVar11,length_00);
    }
    else {
      lVar6 = 0;
      do {
        lVar9 = lVar6;
        cVar12 = "_GLOBAL__N_"[lVar9];
        if (cVar10 != cVar12) goto LAB_0027315e;
        cVar10 = pcVar3[lVar9 + lVar4];
        lVar6 = lVar9 + 1;
      } while (cVar10 != '\0');
      cVar12 = "_GLOBAL__N_"[lVar9 + 1];
LAB_0027315e:
      if (cVar12 != '\0') goto LAB_00273163;
      MaybeAppend(state,"(anonymous namespace)");
    }
    (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + uVar5;
    iVar8 = state->recursion_depth + -1;
    bVar7 = true;
  }
  else {
LAB_002730e2:
    (state->parse_state).mangled_idx = (undefined4)local_28;
    (state->parse_state).out_cur_idx = local_28._4_4_;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_20;
    bVar7 = false;
  }
  iVar8 = iVar8 + -1;
LAB_002730f2:
  state->recursion_depth = iVar8;
  return bVar7;
}

Assistant:

static bool ParseSourceName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  int length = -1;
  if (ParseNumber(state, &length) &&
      ParseIdentifier(state, static_cast<size_t>(length))) {
    return true;
  }
  state->parse_state = copy;
  return false;
}